

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::SolveSystemPhi(TPZDohrSubstruct<std::complex<float>_> *this)

{
  TPZFMatrix<std::complex<float>_> *this_00;
  complex<float> *pcVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  complex<float> value;
  ulong uVar5;
  long newCols;
  TPZFMatrix<std::complex<float>_> I_lambda;
  TPZFMatrix<std::complex<float>_> local_150;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  uVar4 = (uint)(this->fCoarseIndex).fNElements;
  newCols = (long)(int)uVar4;
  lVar2 = (this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow +
          newCols;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  local_150.fElem = (complex<float> *)0x0;
  local_150.fGiven = (complex<float> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = newCols;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_150.fWork.fStore = (complex<float> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar3 = lVar2 * newCols;
  if (uVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar3 < 0x2000000000000000) {
      uVar5 = uVar3 * 8;
    }
    pcVar1 = (complex<float> *)operator_new__(uVar5);
    memset(pcVar1,0,uVar3 * 8);
    local_150.fElem = pcVar1;
  }
  memset(local_150.fElem,0,
         local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow *
         local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol * 8);
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ =
       local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      if ((local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= (long)uVar3)
         || (local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= (long)uVar3
            )) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_150.fElem
      [local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * uVar3 + uVar3].
      _M_value = 0x3f800000;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  lVar2 = (this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow +
          newCols;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  local_c0.fElem = (complex<float> *)0x0;
  local_c0.fGiven = (complex<float> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar2;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = newCols;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_c0.fWork.fStore = (complex<float> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar3 = lVar2 * newCols;
  if (uVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (uVar3 < 0x2000000000000000) {
      uVar5 = uVar3 * 8;
    }
    pcVar1 = (complex<float> *)operator_new__(uVar5);
    memset(pcVar1,0,uVar3 * 8);
    local_c0.fElem = pcVar1;
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->finv,&local_150,&local_c0,(TPZFMatrix<std::complex<float>_> *)0x0);
  this_00 = &this->fPhiC;
  TPZFMatrix<std::complex<float>_>::Resize(this_00,(long)this->fNEquations,newCols);
  value._M_value = (_ComplexT)&local_c0;
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<float>_>,
             (TPZFMatrix<std::complex<float>_> *)value._M_value,this_00,0);
  TPZFMatrix<std::complex<float>_>::operator*=(this_00,value);
  ComputeCoarseStiffness(this);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}